

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type)

{
  BaseType BVar1;
  bool bVar2;
  uint uVar3;
  SPIRType *pSVar4;
  undefined4 in_stack_fffffffffffffde4;
  char *op_local;
  string local_200;
  string expr;
  string cast_op1;
  string cast_op0;
  SPIRType expected_type;
  
  cast_op0._M_dataplus._M_p = (pointer)&cast_op0.field_2;
  cast_op0._M_string_length = 0;
  cast_op0.field_2._M_local_buf[0] = '\0';
  cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
  cast_op1._M_string_length = 0;
  cast_op1.field_2._M_local_buf[0] = '\0';
  uVar3 = (uint)skip_cast_if_equal_type;
  op_local = op;
  binary_op_bitcast_helper
            (&expected_type,this,&cast_op0,&cast_op1,&input_type,op0,op1,skip_cast_if_equal_type);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  BVar1 = *(BaseType *)&(pSVar4->super_IVariant).field_0xc;
  if (BVar1 == Boolean || BVar1 == input_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_200,(spirv_cross *)&op_local,(char **)0x3b5f90,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffde4,uVar3));
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_200);
  }
  else {
    expected_type.super_IVariant._12_4_ = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x3a])(&local_200,this,pSVar4);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::push_back((char)&expr);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_200,(spirv_cross *)&op_local,(char **)0x3b5f90,(char (*) [2])&cast_op0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b2a97,
               (char (*) [3])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39e39a,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffde4,uVar3));
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::push_back((char)&expr);
  }
  bVar2 = should_forward(this,op0);
  if (bVar2) {
    bVar2 = should_forward(this,op1);
  }
  else {
    bVar2 = false;
  }
  emit_op(this,result_type,result_id,&expr,bVar2,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  ::std::__cxx11::string::~string((string *)&expr);
  SPIRType::~SPIRType(&expected_type);
  ::std::__cxx11::string::~string((string *)&cast_op1);
  ::std::__cxx11::string::~string((string *)&cast_op0);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                            const char *op, SPIRType::BaseType input_type, bool skip_cast_if_equal_type)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	string expr;
	if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}